

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

Status __thiscall leveldb::DBImpl::MakeRoomForWrite(DBImpl *this,bool force)

{
  uint64_t number;
  Env *pEVar1;
  _func_int **pp_Var2;
  DB DVar3;
  WritableFile *dest;
  int iVar4;
  _func_int **pp_Var5;
  size_t sVar6;
  Writer *pWVar7;
  MemTable *this_00;
  byte in_DL;
  byte bVar8;
  undefined7 in_register_00000031;
  DBImpl *this_01;
  char *format;
  Logger *info_log;
  unique_lock *puVar9;
  pthread_mutex_t *__mutex;
  WritableFile *lfile;
  DB local_88;
  WritableFile *local_80;
  undefined1 local_78 [32];
  uint64_t local_58;
  pthread_mutex_t *local_50;
  InternalKeyComparator *local_48;
  unique_lock *local_40;
  string *local_38;
  
  this_01 = (DBImpl *)CONCAT71(in_register_00000031,force);
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  pp_Var5 = (_func_int **)(this_01->bg_error_).state_;
  if (pp_Var5 == (_func_int **)0x0) {
    __mutex = (pthread_mutex_t *)&this_01->mutex_;
    bVar8 = in_DL ^ 1;
    puVar9 = (unique_lock *)&this_01->background_work_finished_signal_;
    local_38 = &this_01->dbname_;
    local_48 = &this_01->internal_comparator_;
    local_50 = __mutex;
    local_40 = puVar9;
    do {
      if (((bVar8 & 1) == 0) ||
         (iVar4 = VersionSet::NumLevelFiles(this_01->versions_,0), iVar4 < 0x10)) {
        if (((in_DL & 1) == 0) &&
           (sVar6 = MemTable::ApproximateMemoryUsage(this_01->mem_),
           sVar6 <= (this_01->options_).write_buffer_size)) {
          return (Status)(char *)this;
        }
        if (this_01->imm_ == (MemTable *)0x0) {
          iVar4 = VersionSet::NumLevelFiles(this_01->versions_,0);
          if (iVar4 < 0x40) {
            number = this_01->versions_->next_file_number_;
            local_58 = number + 1;
            this_01->versions_->next_file_number_ = local_58;
            local_80 = (WritableFile *)0x0;
            pEVar1 = this_01->env_;
            LogFileName((string *)local_78,local_38,number);
            (*pEVar1->_vptr_Env[4])(&local_88,pEVar1,(string *)local_78,&local_80);
            DVar3._vptr_DB = local_88._vptr_DB;
            (this->super_DB)._vptr_DB = local_88._vptr_DB;
            local_88._vptr_DB = (_func_int **)0x0;
            if ((Mutex *)local_78._0_8_ != (Mutex *)(local_78 + 0x10)) {
              operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
            }
            if (DVar3._vptr_DB != (_func_int **)0x0) {
              if (this_01->versions_->next_file_number_ != local_58) {
                return (Status)(char *)this;
              }
              this_01->versions_->next_file_number_ = number;
              return (Status)(char *)this;
            }
            pWVar7 = this_01->log_;
            if (pWVar7 != (Writer *)0x0) {
              log::Writer::~Writer(pWVar7);
            }
            operator_delete(pWVar7,0x20);
            __mutex = local_50;
            if (this_01->logfile_ != (WritableFile *)0x0) {
              (*this_01->logfile_->_vptr_WritableFile[1])();
            }
            dest = local_80;
            this_01->logfile_ = local_80;
            this_01->logfile_number_ = number;
            pWVar7 = (Writer *)operator_new(0x20);
            log::Writer::Writer(pWVar7,dest);
            this_01->log_ = pWVar7;
            this_01->imm_ = this_01->mem_;
            (this_01->has_imm_)._M_base._M_i = true;
            this_00 = (MemTable *)operator_new(0x70);
            MemTable::MemTable(this_00,local_48);
            this_01->mem_ = this_00;
            this_00->refs_ = this_00->refs_ + 1;
            MaybeScheduleCompaction(this_01);
            in_DL = 0;
            puVar9 = local_40;
            goto LAB_0010d4ef;
          }
          info_log = (this_01->options_).info_log;
          format = "Too many L0 files; waiting...\n";
        }
        else {
          info_log = (this_01->options_).info_log;
          format = "Current memtable full; waiting...\n";
        }
        Log(info_log,format);
        local_78._0_8_ = (this_01->background_work_finished_signal_).mu_;
        local_78[8] = 1;
        std::condition_variable::wait(puVar9);
      }
      else {
        pthread_mutex_unlock(__mutex);
        (*this_01->env_->_vptr_Env[0x14])();
        iVar4 = pthread_mutex_lock(__mutex);
        if (iVar4 != 0) {
          std::__throw_system_error(iVar4);
        }
        bVar8 = 0;
      }
LAB_0010d4ef:
      pp_Var5 = (_func_int **)(this_01->bg_error_).state_;
    } while (pp_Var5 == (_func_int **)0x0);
    pp_Var2 = (this->super_DB)._vptr_DB;
    if (pp_Var2 == pp_Var5) {
      return (Status)(char *)this;
    }
    if (pp_Var2 != (_func_int **)0x0) {
      operator_delete__(pp_Var2);
      pp_Var5 = (_func_int **)(this_01->bg_error_).state_;
      if (pp_Var5 == (_func_int **)0x0) {
        pp_Var5 = (_func_int **)0x0;
        goto LAB_0010d3db;
      }
    }
  }
  pp_Var5 = (_func_int **)Status::CopyState((char *)pp_Var5);
LAB_0010d3db:
  (this->super_DB)._vptr_DB = pp_Var5;
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::MakeRoomForWrite(bool force) {
  mutex_.AssertHeld();
  assert(!writers_.empty());
  bool allow_delay = !force;
  Status s;
  while (true) {
    if (!bg_error_.ok()) {
      // Yield previous error
      s = bg_error_;
      break;
    } else if (allow_delay && versions_->NumLevelFiles(0) >=
                                  config::kL0_SlowdownWritesTrigger) {
      // We are getting close to hitting a hard limit on the number of
      // L0 files.  Rather than delaying a single write by several
      // seconds when we hit the hard limit, start delaying each
      // individual write by 1ms to reduce latency variance.  Also,
      // this delay hands over some CPU to the compaction thread in
      // case it is sharing the same core as the writer.
      mutex_.Unlock();
      env_->SleepForMicroseconds(1000);
      allow_delay = false;  // Do not delay a single write more than once
      mutex_.Lock();
    } else if (!force &&
               (mem_->ApproximateMemoryUsage() <= options_.write_buffer_size)) {
      // There is room in current memtable
      break;
    } else if (imm_ != nullptr) {
      // We have filled up the current memtable, but the previous
      // one is still being compacted, so we wait.
      Log(options_.info_log, "Current memtable full; waiting...\n");
      background_work_finished_signal_.Wait();
    } else if (versions_->NumLevelFiles(0) >= config::kL0_StopWritesTrigger) {
      // There are too many level-0 files.
      Log(options_.info_log, "Too many L0 files; waiting...\n");
      background_work_finished_signal_.Wait();
    } else {
      // Attempt to switch to a new memtable and trigger compaction of old
      assert(versions_->PrevLogNumber() == 0);
      uint64_t new_log_number = versions_->NewFileNumber();
      WritableFile* lfile = nullptr;
      s = env_->NewWritableFile(LogFileName(dbname_, new_log_number), &lfile);
      if (!s.ok()) {
        // Avoid chewing through file number space in a tight loop.
        versions_->ReuseFileNumber(new_log_number);
        break;
      }
      delete log_;
      delete logfile_;
      logfile_ = lfile;
      logfile_number_ = new_log_number;
      log_ = new log::Writer(lfile);
      imm_ = mem_;
      has_imm_.store(true, std::memory_order_release);
      mem_ = new MemTable(internal_comparator_);
      mem_->Ref();
      force = false;  // Do not force another compaction if have room
      MaybeScheduleCompaction();
    }
  }
  return s;
}